

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_l10n.c
# Opt level: O1

void test_l10n(CuTest *tc)

{
  char *pcVar1;
  l10n_text txt;
  char buffer [32];
  l10n_text local_70;
  char local_58 [40];
  
  l10n_text_init(&local_70);
  pcVar1 = l10n_text_render(&local_70,local_58,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x1e,(char *)0x0,local_58,pcVar1);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x1f,(char *)0x0,"",local_58);
  l10n_text_assign(&local_70,"$name\'s blog (%num stars)","$name","Enno","%num",0x2a,0);
  pcVar1 = l10n_text_render(&local_70,local_58,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x22,(char *)0x0,local_58,pcVar1);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x23,(char *)0x0,"Enno\'s blog (42 stars)",local_58);
  l10n_text_assign(&local_70,"Hodor",0);
  pcVar1 = l10n_text_render(&local_70,local_58,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x26,(char *)0x0,local_58,pcVar1);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x27,(char *)0x0,"Hodor",local_58);
  l10n_text_assign(&local_70,(char *)0x0);
  pcVar1 = l10n_text_render(&local_70,local_58,0x20);
  CuAssertPtrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x2a,(char *)0x0,local_58,pcVar1);
  CuAssertStrEquals_LineMsg
            (tc,"/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_l10n.c",
             0x2b,(char *)0x0,"",local_58);
  l10n_text_free(&local_70);
  return;
}

Assistant:

static void test_l10n(CuTest * tc)
{
    char buffer[32];
    l10n_text txt;

    l10n_text_init(&txt);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "", buffer);

    l10n_text_assign(&txt, "$name's blog (%num stars)", "$name", "Enno", "%num", 42, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Enno's blog (42 stars)", buffer);

    l10n_text_assign(&txt, "Hodor", NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "Hodor", buffer);

    l10n_text_assign(&txt, NULL);
    CuAssertPtrEquals(tc, buffer, l10n_text_render(&txt, buffer, sizeof(buffer)));
    CuAssertStrEquals(tc, "", buffer);

    l10n_text_free(&txt);
}